

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# res0.c
# Opt level: O0

vorbis_info_residue * res0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  long *i;
  long lVar3;
  int local_54;
  int local_50;
  int partvals;
  int dim;
  int entries;
  int book;
  int c;
  int cflag;
  int cascade;
  codec_setup_info *ci;
  vorbis_info_residue0 *info;
  int acc;
  int j;
  oggpack_buffer *opb_local;
  vorbis_info *vi_local;
  
  info._0_4_ = 0;
  i = (long *)calloc(1,0xb20);
  pvVar1 = vi->codec_setup;
  lVar3 = oggpack_read(opb,0x18);
  *i = lVar3;
  lVar3 = oggpack_read(opb,0x18);
  i[1] = lVar3;
  lVar3 = oggpack_read(opb,0x18);
  *(int *)(i + 2) = (int)lVar3 + 1;
  lVar3 = oggpack_read(opb,6);
  *(int *)((long)i + 0x14) = (int)lVar3 + 1;
  lVar3 = oggpack_read(opb,8);
  *(int *)((long)i + 0x1c) = (int)lVar3;
  if (-1 < *(int *)((long)i + 0x1c)) {
    for (info._4_4_ = 0; info._4_4_ < *(int *)((long)i + 0x14); info._4_4_ = info._4_4_ + 1) {
      lVar3 = oggpack_read(opb,3);
      c = (int)lVar3;
      lVar3 = oggpack_read(opb,1);
      if ((int)lVar3 < 0) goto LAB_002cf240;
      if ((int)lVar3 != 0) {
        lVar3 = oggpack_read(opb,5);
        if ((int)lVar3 < 0) goto LAB_002cf240;
        c = (int)lVar3 << 3 | c;
      }
      *(int *)((long)i + (long)info._4_4_ * 4 + 0x20) = c;
      iVar2 = icount(c);
      info._0_4_ = iVar2 + (int)info;
    }
    for (info._4_4_ = 0; info._4_4_ < (int)info; info._4_4_ = info._4_4_ + 1) {
      lVar3 = oggpack_read(opb,8);
      if ((int)lVar3 < 0) goto LAB_002cf240;
      *(int *)((long)i + (long)info._4_4_ * 4 + 0x120) = (int)lVar3;
    }
    if (*(int *)((long)i + 0x1c) < *(int *)((long)pvVar1 + 0x20)) {
      for (info._4_4_ = 0; info._4_4_ < (int)info; info._4_4_ = info._4_4_ + 1) {
        if ((*(int *)((long)pvVar1 + 0x20) <= *(int *)((long)i + (long)info._4_4_ * 4 + 0x120)) ||
           (*(int *)(*(long *)((long)pvVar1 +
                              (long)*(int *)((long)i + (long)info._4_4_ * 4 + 0x120) * 8 + 0xb28) +
                    0x18) == 0)) goto LAB_002cf240;
      }
      local_50 = (int)**(undefined8 **)((long)pvVar1 + (long)*(int *)((long)i + 0x1c) * 8 + 0xb28);
      local_54 = 1;
      if (0 < local_50) {
        while( true ) {
          if (local_50 < 1) {
            *(int *)(i + 3) = local_54;
            return i;
          }
          local_54 = *(int *)((long)i + 0x14) * local_54;
          if ((int)*(undefined8 *)
                    (*(long *)((long)pvVar1 + (long)*(int *)((long)i + 0x1c) * 8 + 0xb28) + 8) <
              local_54) break;
          local_50 = local_50 + -1;
        }
      }
    }
  }
LAB_002cf240:
  res0_free_info(i);
  return (vorbis_info_residue *)0x0;
}

Assistant:

vorbis_info_residue *res0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int j,acc=0;
  vorbis_info_residue0 *info=_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=vi->codec_setup;

  info->begin=oggpack_read(opb,24);
  info->end=oggpack_read(opb,24);
  info->grouping=oggpack_read(opb,24)+1;
  info->partitions=oggpack_read(opb,6)+1;
  info->groupbook=oggpack_read(opb,8);

  /* check for premature EOP */
  if(info->groupbook<0)goto errout;

  for(j=0;j<info->partitions;j++){
    int cascade=oggpack_read(opb,3);
    int cflag=oggpack_read(opb,1);
    if(cflag<0) goto errout;
    if(cflag){
      int c=oggpack_read(opb,5);
      if(c<0) goto errout;
      cascade|=(c<<3);
    }
    info->secondstages[j]=cascade;

    acc+=icount(cascade);
  }
  for(j=0;j<acc;j++){
    int book=oggpack_read(opb,8);
    if(book<0) goto errout;
    info->booklist[j]=book;
  }

  if(info->groupbook>=ci->books)goto errout;
  for(j=0;j<acc;j++){
    if(info->booklist[j]>=ci->books)goto errout;
    if(ci->book_param[info->booklist[j]]->maptype==0)goto errout;
  }

  /* verify the phrasebook is not specifying an impossible or
     inconsistent partitioning scheme. */
  /* modify the phrasebook ranging check from r16327; an early beta
     encoder had a bug where it used an oversized phrasebook by
     accident.  These files should continue to be playable, but don't
     allow an exploit */
  {
    int entries = ci->book_param[info->groupbook]->entries;
    int dim = ci->book_param[info->groupbook]->dim;
    int partvals = 1;
    if (dim<1) goto errout;
    while(dim>0){
      partvals *= info->partitions;
      if(partvals > entries) goto errout;
      dim--;
    }
    info->partvals = partvals;
  }

  return(info);
 errout:
  res0_free_info(info);
  return(NULL);
}